

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *protopath;
  char *__s1;
  char *parampath;
  char *binpath;
  int iVar1;
  DataReaderFromEmpty dr;
  NetOptimize optimizer;
  DataReader local_b0;
  NetOptimize local_a8;
  
  if (argc == 6) {
    protopath = argv[1];
    __s1 = argv[2];
    parampath = argv[3];
    binpath = argv[4];
    iVar1 = atoi(argv[5]);
    ncnn::Net::Net(&local_a8.super_Net);
    local_a8.storage_type = (int)(iVar1 == 1);
    ncnn::Net::load_param(&local_a8.super_Net,protopath);
    iVar1 = strcmp(__s1,"null");
    if (iVar1 == 0) {
      local_b0._vptr_DataReader = (_func_int **)&PTR__DataReader_001917d0;
      ncnn::Net::load_model(&local_a8.super_Net,&local_b0);
      ncnn::DataReader::~DataReader(&local_b0);
    }
    else {
      ncnn::Net::load_model(&local_a8.super_Net,__s1);
    }
    NetOptimize::fuse_batchnorm_scale(&local_a8);
    NetOptimize::fuse_convolution_batchnorm(&local_a8);
    NetOptimize::fuse_convolutiondepthwise_batchnorm(&local_a8);
    NetOptimize::fuse_deconvolution_batchnorm(&local_a8);
    NetOptimize::fuse_deconvolutiondepthwise_batchnorm(&local_a8);
    NetOptimize::fuse_innerproduct_batchnorm(&local_a8);
    NetOptimize::fuse_innerproduct_dropout(&local_a8);
    NetOptimize::fuse_convolution_activation(&local_a8);
    NetOptimize::fuse_convolutiondepthwise_activation(&local_a8);
    NetOptimize::fuse_deconvolution_activation(&local_a8);
    NetOptimize::fuse_deconvolutiondepthwise_activation(&local_a8);
    NetOptimize::fuse_innerproduct_activation(&local_a8);
    NetOptimize::eliminate_dropout(&local_a8);
    NetOptimize::eliminate_pooling1x1(&local_a8);
    NetOptimize::eliminate_noop(&local_a8);
    NetOptimize::eliminate_flatten_after_global_pooling(&local_a8);
    NetOptimize::eliminate_reshape_after_global_pooling(&local_a8);
    NetOptimize::eliminate_reshape_before_binaryop(&local_a8);
    NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(&local_a8);
    NetOptimize::replace_convolution_with_innerproduct_after_innerproduct(&local_a8);
    NetOptimize::eliminate_flatten_after_innerproduct(&local_a8);
    NetOptimize::eliminate_orphaned_memorydata(&local_a8);
    NetOptimize::save(&local_a8,parampath,binpath);
    ncnn::Net::~Net(&local_a8.super_Net);
    iVar1 = 0;
  }
  else {
    main_cold_1();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
#if defined(__aarch64__) && defined(LINUX)
    if (argc != 10)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [flag] [dataname] [w] [h] [c]\n", argv[0]);
        return -1;
    }
    const char* dataname = argv[6];
    int inw = atoi(argv[7]);
    int inh = atoi(argv[8]);
    int inc = atoi(argv[9]);
#else
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [flag]\n", argv[0]);
        return -1;
    }
#endif // defined(__aarch64__) && defined(LINUX)

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    int flag = atoi(argv[5]);

    NetOptimize optimizer;

    if (flag == 1)
    {
        optimizer.storage_type = 1;
    }
    else
    {
        optimizer.storage_type = 0;
    }

    optimizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        optimizer.load_model(dr);
    }
    else
        optimizer.load_model(inbin);

#if defined(__aarch64__) && defined(LINUX)
    optimizer.find_fastest_fp32_conv(dataname, inw, inh, inc);
#endif // defined(__aarch64__) && defined(LINUX)
    optimizer.fuse_batchnorm_scale();
    optimizer.fuse_convolution_batchnorm();
    optimizer.fuse_convolutiondepthwise_batchnorm();
    optimizer.fuse_deconvolution_batchnorm();
    optimizer.fuse_deconvolutiondepthwise_batchnorm();
    optimizer.fuse_innerproduct_batchnorm();
    optimizer.fuse_innerproduct_dropout();
    optimizer.fuse_convolution_activation();
    optimizer.fuse_convolutiondepthwise_activation();
    optimizer.fuse_deconvolution_activation();
    optimizer.fuse_deconvolutiondepthwise_activation();
    optimizer.fuse_innerproduct_activation();

    optimizer.eliminate_dropout();
    optimizer.eliminate_pooling1x1();
    optimizer.eliminate_noop();
    optimizer.eliminate_flatten_after_global_pooling();
    optimizer.eliminate_reshape_after_global_pooling();
    optimizer.eliminate_reshape_before_binaryop();

    optimizer.replace_convolution_with_innerproduct_after_global_pooling();
    optimizer.replace_convolution_with_innerproduct_after_innerproduct();

    optimizer.eliminate_flatten_after_innerproduct();
    optimizer.eliminate_orphaned_memorydata();

    optimizer.save(outparam, outbin);

    return 0;
}